

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

FILE * __thiscall Pathie::Path::fopen(Path *this,char *__filename,char *__modes)

{
  char *__filename_00;
  FILE *pFVar1;
  ErrnoError *this_00;
  int *piVar2;
  FILE *ptr;
  string nstr;
  char *mode_local;
  Path *this_local;
  
  native_abi_cxx11_((Path *)&ptr);
  __filename_00 = (char *)std::__cxx11::string::c_str();
  pFVar1 = ::fopen(__filename_00,__filename);
  if (pFVar1 != (FILE *)0x0) {
    std::__cxx11::string::~string((string *)&ptr);
    return pFVar1;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
}

Assistant:

FILE* Path::fopen(const char* mode) const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();

  FILE* ptr = ::fopen(nstr.c_str(), mode);
  if (ptr)
    return ptr;
  else
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  std::wstring utf16_path = utf8_to_utf16(m_path);
  std::wstring utf16_mode = utf8_to_utf16(mode);
  FILE* ptr = _wfopen(utf16_path.c_str(), utf16_mode.c_str());

  if (ptr)
    return ptr;
  else
    throw(Pathie::ErrnoError(errno));
#else
#error Unsupported system.
#endif
}